

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesMainForm.cxx
# Opt level: O3

void __thiscall cmCursesMainForm::PrintKeys(cmCursesMainForm *this,int process)

{
  FORM *form;
  bool bVar1;
  char cVar2;
  FIELD *field;
  long *plVar3;
  size_t sVar4;
  char *pcVar5;
  int iVar6;
  char fmt_s [3];
  char firstLine [512];
  char thirdLine [512];
  char secondLine [512];
  char fmt [512];
  undefined2 local_83c;
  undefined1 local_83a;
  char local_838 [512];
  char local_638 [512];
  undefined4 local_438;
  undefined4 uStack_434;
  undefined4 uStack_430;
  undefined4 uStack_42c;
  undefined4 local_428;
  undefined4 uStack_424;
  undefined4 uStack_420;
  undefined4 uStack_41c;
  undefined4 local_418;
  undefined4 uStack_414;
  undefined4 uStack_410;
  undefined4 uStack_40c;
  undefined4 local_408;
  undefined4 uStack_404;
  undefined4 uStack_400;
  undefined4 uStack_3fc;
  undefined4 local_3f8;
  undefined4 local_238;
  undefined4 uStack_234;
  undefined4 uStack_230;
  undefined4 uStack_22c;
  undefined3 uStack_228;
  undefined4 uStack_225;
  undefined4 uStack_221;
  
  if (_stdscr == 0) {
    return;
  }
  if ((short)*(ushort *)(_stdscr + 6) < 0x40) {
    return;
  }
  iVar6 = (int)*(short *)(_stdscr + 4);
  if (*(short *)(_stdscr + 4) < 5 || (int)(*(ushort *)(_stdscr + 6) + 1) < this->InitialWidth) {
    return;
  }
  form = (this->super_cmCursesForm).Form;
  if (form == (FORM *)0x0) {
LAB_0013ec5d:
    local_83a = 0;
    local_83c = 0x7325;
    bVar1 = true;
    plVar3 = (long *)0x0;
LAB_0013ec63:
    memset(local_838,0,0x200);
    memset(&local_438,0,0x200);
    memset(local_638,0,0x200);
    if (process == 0) {
      if (this->OkToGenerate == true) {
        builtin_strncpy(local_838 + 0x30,"te and exit",0xc);
        builtin_strncpy(local_838 + 0x20,"ss [g] to genera",0x10);
        builtin_strncpy(local_838 + 0x18,"     Pre",8);
      }
      else {
        builtin_strncpy(local_838 + 0x30,"           ",0xc);
        builtin_strncpy(local_838 + 0x20,"                ",0x10);
        builtin_strncpy(local_838 + 0x18,"        ",8);
      }
      builtin_strncpy(local_838,"Press [c] to configure  ",0x18);
      pcVar5 = "Off";
      if (this->AdvancedMode != false) {
        pcVar5 = "On";
      }
      sprintf(local_638,"Press [t] to toggle advanced mode (Currently %s)",pcVar5);
      memcpy(&local_438,"Press [h] for help           Press [q] to quit without generating",0x42);
    }
    else {
      builtin_strncpy(local_838 + 0x40,"    ",4);
      builtin_strncpy(local_838 + 0x30,"                ",0x10);
      builtin_strncpy(local_838 + 0x20,"                ",0x10);
      builtin_strncpy(local_838 + 0x10,"                ",0x10);
      builtin_strncpy(local_838,"                ",0x10);
      local_438 = 0x20202020;
      uStack_434 = 0x20202020;
      uStack_430 = 0x20202020;
      uStack_42c = 0x20202020;
      local_428 = 0x20202020;
      uStack_424 = 0x20202020;
      uStack_420 = 0x20202020;
      uStack_41c = 0x20202020;
      local_418 = 0x20202020;
      uStack_414 = 0x20202020;
      uStack_410 = 0x20202020;
      uStack_40c = 0x20202020;
      local_408 = 0x20202020;
      uStack_404 = 0x20202020;
      uStack_400 = 0x20202020;
      uStack_3fc = 0x20202020;
      local_3f8 = 0x20202020;
      builtin_strncpy(local_638,
                      "                                                                    ",0x44);
    }
    move(iVar6 + -3,0);
    memcpy(&local_238,"Press [enter] to edit option Press [d] to delete an entry",0x200);
    if (process != 0) {
      uStack_228 = 0x202020;
      uStack_225 = 0x20202020;
      uStack_221 = 0x20202020;
      local_238 = 0x20202020;
      uStack_234 = 0x20202020;
      uStack_230 = 0x20202020;
      uStack_22c = 0x20202020;
    }
    printw(&local_83c,&local_238);
    move(iVar6 + -2,0);
    printw(&local_83c,local_838);
    move(iVar6 + -1,0);
    printw(&local_83c,&local_438);
    move(iVar6,0);
    printw(&local_83c);
    if (bVar1) goto LAB_0013eec7;
  }
  else {
    field = current_field(form);
    plVar3 = (long *)field_userptr(field);
    local_83a = 0;
    local_83c = 0x7325;
    if (plVar3 == (long *)0x0) goto LAB_0013ec5d;
    cVar2 = (**(code **)(*plVar3 + 0x30))(plVar3);
    if (cVar2 == '\0') {
      bVar1 = false;
      goto LAB_0013ec63;
    }
  }
  memset(local_838,0,0x200);
  sprintf(local_838,"Page %d of %d",(ulong)*(uint *)(plVar3 + 7),(ulong)(uint)this->NumberOfPages);
  sVar4 = strlen(local_838);
  move(0,0x40 - (int)sVar4);
  printw(&local_83c,local_838);
LAB_0013eec7:
  pos_form_cursor((this->super_cmCursesForm).Form);
  return;
}

Assistant:

void cmCursesMainForm::PrintKeys(int process /* = 0 */)
{
  int x, y;
  getmaxyx(stdscr, y, x);
  if (x < cmCursesMainForm::MIN_WIDTH || x < this->InitialWidth ||
      y < cmCursesMainForm::MIN_HEIGHT) {
    return;
  }

  // Give the current widget (if it exists), a chance to print keys
  cmCursesWidget* cw = nullptr;
  if (this->Form) {
    FIELD* currentField = current_field(this->Form);
    cw = reinterpret_cast<cmCursesWidget*>(field_userptr(currentField));
  }

  char fmt_s[] = "%s";
  if (cw == nullptr || !cw->PrintKeys()) {
    char firstLine[512] = "";
    char secondLine[512] = "";
    char thirdLine[512] = "";
    if (process) {
      memset(firstLine, ' ', 68);
      memset(secondLine, ' ', 68);
      memset(thirdLine, ' ', 68);
    } else {
      if (this->OkToGenerate) {
        sprintf(firstLine,
                "Press [c] to configure       Press [g] to generate and exit");
      } else {
        sprintf(firstLine,
                "Press [c] to configure                                     ");
      }
      {
        const char* toggleKeyInstruction =
          "Press [t] to toggle advanced mode (Currently %s)";
        sprintf(thirdLine, toggleKeyInstruction,
                this->AdvancedMode ? "On" : "Off");
      }
      sprintf(secondLine,
              "Press [h] for help           "
              "Press [q] to quit without generating");
    }

    curses_move(y - 4, 0);
    char fmt[512] =
      "Press [enter] to edit option Press [d] to delete an entry";
    if (process) {
      memset(fmt, ' ', 27);
    }
    printw(fmt_s, fmt);
    curses_move(y - 3, 0);
    printw(fmt_s, firstLine);
    curses_move(y - 2, 0);
    printw(fmt_s, secondLine);
    curses_move(y - 1, 0);
    printw(fmt_s, thirdLine);
  }

  if (cw) {
    char pageLine[512] = "";
    sprintf(pageLine, "Page %d of %d", cw->GetPage(), this->NumberOfPages);
    curses_move(0, 65 - static_cast<unsigned int>(strlen(pageLine)) - 1);
    printw(fmt_s, pageLine);
  }

  pos_form_cursor(this->Form);
}